

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanImplX11.cpp
# Opt level: O0

vector<const_char_*,_std::allocator<const_char_*>_> *
sf::priv::VulkanImplX11::getGraphicsRequiredInstanceExtensions(void)

{
  bool bVar1;
  int iVar2;
  vector<const_char_*,_std::allocator<const_char_*>_> *unaff_retaddr;
  value_type *in_stack_ffffffffffffffe8;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffffff0;
  
  if ((getGraphicsRequiredInstanceExtensions()::extensions == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getGraphicsRequiredInstanceExtensions()::extensions), iVar2 != 0)
     ) {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x2623ba);
    __cxa_atexit(std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector,
                 &getGraphicsRequiredInstanceExtensions::extensions,&__dso_handle);
    __cxa_guard_release(&getGraphicsRequiredInstanceExtensions()::extensions);
  }
  bVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::empty(unaff_retaddr);
  if (bVar1) {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)"VK_KHR_xlib_surface",
               in_stack_ffffffffffffffe8);
  }
  return &getGraphicsRequiredInstanceExtensions::extensions;
}

Assistant:

const std::vector<const char*>& VulkanImplX11::getGraphicsRequiredInstanceExtensions()
{
    static std::vector<const char*> extensions;

    if (extensions.empty())
    {
        extensions.push_back(VK_KHR_SURFACE_EXTENSION_NAME);
        extensions.push_back(VK_KHR_XLIB_SURFACE_EXTENSION_NAME);
    }

    return extensions;
}